

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

CTypeID cp_decl_constinit(CPState *cp,CType **ctp,CTypeID ctypeid)

{
  char cVar1;
  CTypeID CVar2;
  uint uVar3;
  CTState *cts;
  uint in_EDX;
  long *in_RSI;
  long in_RDI;
  CTypeID constid;
  CPValue k;
  CTSize size;
  CTInfo info;
  CType *ctt;
  undefined4 in_stack_ffffffffffffff88;
  ErrMsg in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint uVar4;
  uint local_54;
  
  cts = (CTState *)(**(long **)(in_RDI + 0x40) + (ulong)in_EDX * 0x10);
  local_54 = in_EDX;
  while (*(uint *)&cts->tab >> 0x1c == 8) {
    local_54 = *(uint *)&cts->tab & 0xffff;
    cts = (CTState *)(**(long **)(in_RDI + 0x40) + (ulong)local_54 * 0x10);
  }
  uVar4 = *(uint *)&cts->tab;
  uVar3 = *(uint *)((long)&cts->tab + 4);
  if ((((uVar4 & 0xfc000000) == 0) && ((uVar4 & 0x2000000) != 0)) && (uVar3 < 5)) {
    cp_check((CPState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff8c);
    cp_expr_sub((CPState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                (CPValue *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),0);
    CVar2 = lj_ctype_new(cts,(CType **)CONCAT44(uVar4,uVar3));
    *(uint *)*in_RSI = (local_54 | 0x2000000) + 0xb0000000;
    cVar1 = (char)uVar3;
    uVar3 = in_stack_ffffffffffffff90 << (('\x04' - cVar1) * '\b' & 0x1fU);
    if ((uVar4 & 0x800000) == 0) {
      uVar3 = (int)uVar3 >> (('\x04' - cVar1) * '\b' & 0x1fU);
    }
    else {
      uVar3 = uVar3 >> (('\x04' - cVar1) * '\b' & 0x1fU);
    }
    *(uint *)(*in_RSI + 4) = uVar3;
    return CVar2;
  }
  cp_err((CPState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
         in_stack_ffffffffffffff8c);
}

Assistant:

static CTypeID cp_decl_constinit(CPState *cp, CType **ctp, CTypeID ctypeid)
{
  CType *ctt = ctype_get(cp->cts, ctypeid);
  CTInfo info;
  CTSize size;
  CPValue k;
  CTypeID constid;
  while (ctype_isattrib(ctt->info)) {  /* Skip attributes. */
    ctypeid = ctype_cid(ctt->info);  /* Update ID, too. */
    ctt = ctype_get(cp->cts, ctypeid);
  }
  info = ctt->info;
  size = ctt->size;
  if (!ctype_isinteger(info) || !(info & CTF_CONST) || size > 4)
    cp_err(cp, LJ_ERR_FFI_INVTYPE);
  cp_check(cp, '=');
  cp_expr_sub(cp, &k, 0);
  constid = lj_ctype_new(cp->cts, ctp);
  (*ctp)->info = CTINFO(CT_CONSTVAL, CTF_CONST|ctypeid);
  k.u32 <<= 8*(4-size);
  if ((info & CTF_UNSIGNED))
    k.u32 >>= 8*(4-size);
  else
    k.u32 = (uint32_t)((int32_t)k.u32 >> 8*(4-size));
  (*ctp)->size = k.u32;
  return constid;
}